

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextAnalyzer.cpp
# Opt level: O0

unsigned_long TextAnalyzer::findOperator(string_conflict *toSeparate,short *opLen)

{
  allocator<unsigned_long> *this;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  pointer puVar1;
  iterator iVar2;
  iterator iVar3;
  reference puVar4;
  char cVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_110;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it2;
  unsigned_long local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  iterator local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmpVec2;
  unsigned_long index;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it1;
  allocator<unsigned_long> local_69;
  unsigned_long local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmpVec1;
  short *opLen_local;
  string_conflict *toSeparate_local;
  
  *opLen = 2;
  tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)opLen;
  local_68 = std::__cxx11::string::find((char *)toSeparate,0x14b701);
  local_60 = std::__cxx11::string::find((char *)toSeparate,0x14b704);
  local_58 = std::__cxx11::string::find((char *)toSeparate,0x14b6fe);
  local_50 = std::__cxx11::string::find((char *)toSeparate,0x14b6fb);
  local_48 = std::__cxx11::string::find((char *)toSeparate,0x14b704);
  local_40 = &local_68;
  local_38 = 5;
  std::allocator<unsigned_long>::allocator(&local_69);
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,__l_00,&local_69);
  std::allocator<unsigned_long>::~allocator(&local_69);
  iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  local_88 = std::
             min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (iVar2._M_current,iVar3._M_current);
  puVar4 = __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&local_88);
  tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)*puVar4;
  if (tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0xffffffffffffffff) {
    cVar5 = (char)toSeparate;
    local_100 = std::__cxx11::string::find(cVar5,0x3d);
    local_f8 = std::__cxx11::string::find(cVar5,0x3c);
    local_f0 = std::__cxx11::string::find(cVar5,0x3e);
    local_e8 = std::__cxx11::string::find(cVar5,0x7b);
    local_e0 = std::__cxx11::string::find(cVar5,0x7d);
    local_d8 = std::__cxx11::string::find(cVar5,0x28);
    local_d0 = std::__cxx11::string::find(cVar5,0x29);
    local_c8 = &local_100;
    local_c0 = 7;
    this = (allocator<unsigned_long> *)((long)&it2._M_current + 7);
    std::allocator<unsigned_long>::allocator(this);
    __l._M_len = local_c0;
    __l._M_array = local_c8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,__l,this);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)((long)&it2._M_current + 7));
    iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
    iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
    local_110 = std::
                min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          (iVar2._M_current,iVar3._M_current);
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_110);
    tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*puVar4;
    *(undefined2 *)
     tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  }
  puVar1 = tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  return (unsigned_long)puVar1;
}

Assistant:

unsigned long TextAnalyzer::findOperator(string &toSeparate, short &opLen) {
    opLen = 2;
    vector<unsigned long> tmpVec1 = {toSeparate.find("=="), toSeparate.find("!="), toSeparate.find(">="), toSeparate
            .find("<="), toSeparate.find("!=")};
    auto it1 = min_element(tmpVec1.begin(), tmpVec1.end());
    unsigned long index = *(it1);
    if (index == string::npos) {// ==,!=,>=,<=,!= wasn't found - search =,<,>
        vector<unsigned long> tmpVec2 = {toSeparate.find('='), toSeparate.find('<'), toSeparate.find('>'), toSeparate
                .find('{'), toSeparate.find('}'), toSeparate.find('('), toSeparate.find(')')};
        auto it2 = min_element(tmpVec2.begin(), tmpVec2.end());
        index = *(it2);
        opLen = 1;
    }
    return index;
}